

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Frame.cpp
# Opt level: O0

unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> __thiscall
IRT::CAddressInFrame::ToExpression(CAddressInFrame *this)

{
  CBinopExpression *this_00;
  CConstExpression *this_01;
  CMemExpression *this_02;
  long in_RSI;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_78;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_70;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_68;
  undefined1 local_59;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_58;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_50;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_48;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_40 [3];
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_28;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_20;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> offsetExpression;
  CAddressInFrame *this_local;
  
  std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>::
  unique_ptr<std::default_delete<IRT::CExpression_const>,void>
            ((unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>> *)
             &local_20);
  if (*(int *)(in_RSI + 0x10) == 0) {
    (**(code **)(**(long **)(in_RSI + 8) + 0x10))(&local_68);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::operator=
              (&local_20,&local_68);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_68);
  }
  else {
    this_00 = (CBinopExpression *)operator_new(0x20);
    local_59 = 1;
    (**(code **)(**(long **)(in_RSI + 8) + 0x10))(&local_48);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr(local_40,&local_48);
    this_01 = (CConstExpression *)operator_new(0x10);
    CConstExpression::CConstExpression(this_01,*(int *)(in_RSI + 0x10));
    std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>::
    unique_ptr<std::default_delete<IRT::CExpression_const>,void>
              ((unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>> *)
               &local_58,(pointer)this_01);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr(&local_50,&local_58);
    CBinopExpression::CBinopExpression(this_00,local_40,&local_50,PLUS);
    local_59 = 0;
    std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>::
    unique_ptr<std::default_delete<IRT::CExpression_const>,void>
              ((unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>> *)
               &local_28,(pointer)this_00);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::operator=
              (&local_20,&local_28);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_28);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_50);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_58);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(local_40);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_48);
  }
  this_02 = (CMemExpression *)operator_new(0x10);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::unique_ptr
            (&local_78,&local_20);
  CMemExpression::CMemExpression(this_02,&local_78);
  std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>::
  unique_ptr<std::default_delete<IRT::CExpression_const>,void>
            ((unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>> *)
             &local_70,(pointer)this_02);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::unique_ptr
            ((unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
             this,&local_70);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_70);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_78);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_20);
  return (__uniq_ptr_data<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>,_true,_true>
          )(__uniq_ptr_data<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<const CExpression> CAddressInFrame::ToExpression() const {
    std::unique_ptr<const CExpression> offsetExpression;
    if (offset != 0) {
        offsetExpression = std::move(std::unique_ptr<const CExpression>(
                new CBinopExpression(
                        std::move(frameAddress->ToExpression()),
                        std::move(std::unique_ptr<const CExpression>(
                                new CConstExpression(offset)
                        )),
                        TOperationType::PLUS
                )
        ));
    } else {
        offsetExpression = std::move(frameAddress->ToExpression());
    }
    return std::move(std::unique_ptr<const CExpression>(
            new CMemExpression(std::move(offsetExpression))
    ));
}